

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O2

bool vkt::anon_unknown_0::performBoolOp(BoolOp op,bool a,bool b)

{
  switch(op) {
  case BOOLOP_AND:
    return a && b;
  case BOOLOP_OR:
    return a || b;
  case BOOLOP_EQ:
    return a == b;
  case BOOLOP_NEQ:
    return a != b;
  default:
    return false;
  }
}

Assistant:

bool performBoolOp (BoolOp op, bool a, bool b)
{
	switch (op)
	{
		case BOOLOP_OR:
			return a || b;

		case BOOLOP_AND:
			return a && b;

		case BOOLOP_EQ:
			return a == b;

		case BOOLOP_NEQ:
			return a != b;

		default:
			DE_FATAL("Unknown boolean operation.");
			return false;
	}
}